

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_list_dependencies(char *list)

{
  *list = '\0';
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_list_dependencies(char list[1024]) {
  list[0] = '\0';
#if defined(HAVE_MPI)
  strcat(list, " MPI");
#if defined(HAVE_PARMETIS)
  strcat(list, " ParMETIS");
#endif
#if defined(HAVE_PARMETIS)
  strcat(list, " Zoltan");
#endif
#endif
  return REF_SUCCESS;
}